

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-timed.c
# Opt level: O2

_Bool mon_inc_timed(monster *mon,wchar_t effect_type,wchar_t timer,wchar_t flag)

{
  short sVar1;
  stack_type sVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  
  if (effect_type < L'\0') {
    __assert_fail("effect_type >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0xf4,"_Bool mon_inc_timed(struct monster *, int, int, int)");
  }
  if ((uint)effect_type < 10) {
    if (L'\0' < timer) {
      sVar1 = mon->m_timed[(uint)effect_type];
      wVar4 = (wchar_t)sVar1;
      wVar5 = L'\x02';
      if (sVar1 != 0) {
        wVar5 = timer;
      }
      if (timer != L'\x01') {
        wVar5 = timer;
      }
      sVar2 = effects[(uint)effect_type].stacking;
      if (sVar2 == STACK_MAX) {
        timer = wVar4;
        if (wVar4 < wVar5) {
          timer = wVar5;
        }
      }
      else if (sVar2 == STACK_INCR) {
        timer = wVar5 + wVar4;
      }
      else if ((sVar2 == STACK_NO) && (timer = wVar5, sVar1 != 0)) {
        timer = wVar4;
      }
      _Var3 = mon_set_timed(mon,effect_type,timer,flag);
      return _Var3;
    }
    __assert_fail("timer > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0xf6,"_Bool mon_inc_timed(struct monster *, int, int, int)");
  }
  __assert_fail("effect_type < MON_TMD_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                ,0xf5,"_Bool mon_inc_timed(struct monster *, int, int, int)");
}

Assistant:

bool mon_inc_timed(struct monster *mon, int effect_type, int timer, int flag)
{
	assert(effect_type >= 0);
	assert(effect_type < MON_TMD_MAX);
	assert(timer > 0); /* For negative amounts, we use mon_dec_timed instead */

	struct mon_timed_effect *effect = &effects[effect_type];
	int new_value = timer;

	/* Make it last for a mimimum # of turns if it is a new effect */
	if (mon->m_timed[effect_type] == 0 && timer < MON_INC_MIN_TURNS) {
		timer = MON_INC_MIN_TURNS;
	}

	/* Stack effects correctly */
	switch (effect->stacking) {
		case STACK_NO: {
			new_value = mon->m_timed[effect_type];
			if (new_value == 0) {
				new_value = timer;
			}
			break;
		}

		case STACK_MAX: {
			new_value = MAX(mon->m_timed[effect_type], timer);
			break;
		}

		case STACK_INCR: {
			new_value = mon->m_timed[effect_type] + timer;
			break;
		}
	}

	return mon_set_timed(mon, effect_type, new_value, flag);
}